

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O2

void __thiscall QMainWindow::contextMenuEvent(QMainWindow *this,QContextMenuEvent *event)

{
  long lVar1;
  QWidgetData *pQVar2;
  char cVar3;
  bool bVar4;
  QWidget *pQVar5;
  QMenuBar *pQVar6;
  QDockWidget *this_00;
  QWidget *pQVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  event[0xc] = (QContextMenuEvent)0x0;
  pQVar5 = QWidget::childAt(&this->super_QWidget,(QPoint *)(event + 0x28));
  do {
    if ((pQVar5 == (QWidget *)0x0) || (pQVar5 == &this->super_QWidget)) goto LAB_003fc3fe;
    pQVar6 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(&pQVar5->super_QObject);
    if (pQVar6 != (QMenuBar *)0x0) {
LAB_003fc39c:
      if (*(QMainWindow **)(*(long *)&(pQVar6->super_QWidget).field_0x8 + 0x10) == this)
      goto LAB_003fc403;
      goto LAB_003fc44e;
    }
    this_00 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(&pQVar5->super_QObject);
    if (this_00 != (QDockWidget *)0x0) {
      if (*(QMainWindow **)(*(long *)&(this_00->super_QWidget).field_0x8 + 0x10) != this)
      goto LAB_003fc44e;
      pQVar7 = QDockWidget::widget(this_00);
      if (pQVar7 != (QWidget *)0x0) {
        pQVar7 = QDockWidget::widget(this_00);
        pQVar2 = pQVar7->data;
        QWidget::mapFrom(pQVar5,&this->super_QWidget,(QPoint *)(event + 0x28));
        cVar3 = QRect::contains((QPoint *)&pQVar2->crect,true);
        if (cVar3 != '\0') goto LAB_003fc44e;
        goto LAB_003fc403;
      }
LAB_003fc3fe:
      if (pQVar5 != &this->super_QWidget) {
LAB_003fc403:
        pQVar5 = (QWidget *)(**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this);
        if (pQVar5 != (QWidget *)0x0) {
          bVar4 = QMenu::isEmpty((QMenu *)pQVar5);
          if (bVar4) {
            (**(code **)(*(long *)pQVar5 + 0x20))(pQVar5);
          }
          else {
            QWidget::setAttribute(pQVar5,WA_DeleteOnClose,true);
            QMenu::popup((QMenu *)pQVar5,(QPoint *)(event + 0x30),(QAction *)0x0);
            event[0xc] = (QContextMenuEvent)0x1;
          }
        }
      }
LAB_003fc44e:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    pQVar6 = (QMenuBar *)QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&pQVar5->super_QObject);
    if (pQVar6 != (QMenuBar *)0x0) goto LAB_003fc39c;
    pQVar5 = *(QWidget **)(*(long *)&pQVar5->field_0x8 + 0x10);
  } while( true );
}

Assistant:

void QMainWindow::contextMenuEvent(QContextMenuEvent *event)
{
    event->ignore();
    // only show the context menu for direct QDockWidget and QToolBar
    // children and for the menu bar as well
    QWidget *child = childAt(event->pos());
    while (child && child != this) {
#if QT_CONFIG(menubar)
        if (QMenuBar *mb = qobject_cast<QMenuBar *>(child)) {
            if (mb->parentWidget() != this)
                return;
            break;
        }
#endif
#if QT_CONFIG(dockwidget)
        if (QDockWidget *dw = qobject_cast<QDockWidget *>(child)) {
            if (dw->parentWidget() != this)
                return;
            if (dw->widget()
                && dw->widget()->geometry().contains(child->mapFrom(this, event->pos()))) {
                // ignore the event if the mouse is over the QDockWidget contents
                return;
            }
            break;
        }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(toolbar)
        if (QToolBar *tb = qobject_cast<QToolBar *>(child)) {
            if (tb->parentWidget() != this)
                return;
            break;
        }
#endif
        child = child->parentWidget();
    }
    if (child == this)
        return;

#if QT_CONFIG(menu)
    QMenu *popup = createPopupMenu();
    if (popup) {
        if (!popup->isEmpty()) {
            popup->setAttribute(Qt::WA_DeleteOnClose);
            popup->popup(event->globalPos());
            event->accept();
        } else {
            delete popup;
        }
    }
#endif
}